

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

istream * spvtools::utils::
          ParseNormalFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                    (istream *is,bool negate_value,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *this;
  bool bVar1;
  uint_type uVar2;
  ulong uVar3;
  FloatProxy<float> local_40;
  FloatProxy<float> local_3c;
  FloatProxy<float> local_38;
  uint_type local_34;
  uint_type local_30;
  FloatProxy<float> local_2c;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *pHStack_28;
  FloatProxy<float> val;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *value_local;
  bool negate_value_local;
  istream *is_local;
  
  pHStack_28 = value;
  bVar1 = RejectParseDueToLeadingSign<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                    (is,negate_value,value);
  if (!bVar1) {
    operator>>(is,&local_2c);
    if (negate_value) {
      local_30 = (uint_type)FloatProxy<float>::operator-(&local_2c);
      local_2c = (FloatProxy<float>)local_30;
    }
    local_34 = local_2c.data_;
    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
    ::set_value(pHStack_28,local_2c);
    uVar3 = std::ios::fail();
    if (((uVar3 & 1) != 0) &&
       (uVar2 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                ::getUnsignedBits(pHStack_28), uVar2 == 0)) {
      FloatProxy<float>::FloatProxy(&local_3c,0);
      HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
      ::HexFloat((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                  *)&local_38,local_3c);
      (pHStack_28->value_).data_ = local_38.data_;
    }
    bVar1 = FloatProxy<float>::isInfinity(&local_2c);
    this = pHStack_28;
    if (bVar1) {
      bVar1 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
              ::isNegative(pHStack_28);
      if (bVar1 || negate_value) {
        local_40 = FloatProxy<float>::lowest();
      }
      else {
        local_40 = FloatProxy<float>::max();
      }
      HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
      ::set_value(this,local_40);
      std::ios::setstate((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    }
  }
  return is;
}

Assistant:

inline std::istream& ParseNormalFloat(std::istream& is, bool negate_value,
                                      HexFloat<T, Traits>& value) {
  if (RejectParseDueToLeadingSign(is, negate_value, value)) {
    return is;
  }
  T val;
  is >> val;
  if (negate_value) {
    val = -val;
  }
  value.set_value(val);
  // In the failure case, map -0.0 to 0.0.
  if (is.fail() && value.getUnsignedBits() == 0u) {
    value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
  }
  if (val.isInfinity()) {
    // Fail the parse.  Emulate standard behaviour by setting the value to
    // the closest normal value, and set the fail bit on the stream.
    value.set_value((value.isNegative() | negate_value) ? T::lowest()
                                                        : T::max());
    is.setstate(std::ios_base::failbit);
  }
  return is;
}